

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_negation_array2(void)

{
  roaring_bitmap_t *x1;
  roaring_bitmap_t *prVar1;
  roaring_bitmap_t *notted_r1;
  uint32_t i;
  roaring_bitmap_t *r1;
  uint32_t in_stack_0000002c;
  roaring_bitmap_t *in_stack_00000030;
  uint64_t in_stack_ffffffffffffffe8;
  int line;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar2;
  
  x1 = roaring_bitmap_create();
  _assert_true((unsigned_long)notted_r1,(char *)x1,
               (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (int)(in_stack_ffffffffffffffe8 >> 0x20));
  for (uVar2 = 0; uVar2 < 100; uVar2 = uVar2 + 1) {
    roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
    roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  }
  roaring_bitmap_get_cardinality(notted_r1);
  _assert_int_equal((unsigned_long)notted_r1,(unsigned_long)x1,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
                    (int)(in_stack_ffffffffffffffe8 >> 0x20));
  prVar1 = roaring_bitmap_flip(x1,CONCAT44(uVar2,in_stack_fffffffffffffff0),
                               in_stack_ffffffffffffffe8);
  _assert_true((unsigned_long)notted_r1,(char *)x1,(char *)CONCAT44(uVar2,in_stack_fffffffffffffff0)
               ,(int)((ulong)prVar1 >> 0x20));
  roaring_bitmap_get_cardinality(notted_r1);
  _assert_int_equal((unsigned_long)notted_r1,(unsigned_long)x1,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0),(int)((ulong)prVar1 >> 0x20));
  roaring_bitmap_free((roaring_bitmap_t *)0x1125be);
  prVar1 = roaring_bitmap_flip(x1,CONCAT44(uVar2,in_stack_fffffffffffffff0),(uint64_t)prVar1);
  _assert_true((unsigned_long)notted_r1,(char *)x1,(char *)CONCAT44(uVar2,in_stack_fffffffffffffff0)
               ,(int)((ulong)prVar1 >> 0x20));
  roaring_bitmap_get_cardinality(notted_r1);
  _assert_int_equal((unsigned_long)notted_r1,(unsigned_long)x1,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0),(int)((ulong)prVar1 >> 0x20));
  roaring_bitmap_free((roaring_bitmap_t *)0x11261c);
  prVar1 = roaring_bitmap_flip(x1,CONCAT44(uVar2,in_stack_fffffffffffffff0),(uint64_t)prVar1);
  _assert_true((unsigned_long)notted_r1,(char *)x1,(char *)CONCAT44(uVar2,in_stack_fffffffffffffff0)
               ,(int)((ulong)prVar1 >> 0x20));
  roaring_bitmap_get_cardinality(notted_r1);
  _assert_int_equal((unsigned_long)notted_r1,(unsigned_long)x1,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0),(int)((ulong)prVar1 >> 0x20));
  roaring_bitmap_free((roaring_bitmap_t *)0x11267b);
  prVar1 = roaring_bitmap_flip(x1,CONCAT44(uVar2,in_stack_fffffffffffffff0),(uint64_t)prVar1);
  _assert_true((unsigned_long)notted_r1,(char *)x1,(char *)CONCAT44(uVar2,in_stack_fffffffffffffff0)
               ,(int)((ulong)prVar1 >> 0x20));
  roaring_bitmap_get_cardinality(notted_r1);
  _assert_int_equal((unsigned_long)notted_r1,(unsigned_long)x1,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0),(int)((ulong)prVar1 >> 0x20));
  roaring_bitmap_free((roaring_bitmap_t *)0x1126da);
  prVar1 = roaring_bitmap_flip(x1,CONCAT44(uVar2,in_stack_fffffffffffffff0),(uint64_t)prVar1);
  line = (int)((ulong)prVar1 >> 0x20);
  _assert_true((unsigned_long)notted_r1,(char *)x1,(char *)CONCAT44(uVar2,in_stack_fffffffffffffff0)
               ,line);
  roaring_bitmap_get_cardinality(notted_r1);
  _assert_int_equal((unsigned_long)notted_r1,(unsigned_long)x1,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0),line);
  roaring_bitmap_free((roaring_bitmap_t *)0x112739);
  roaring_bitmap_free((roaring_bitmap_t *)0x112743);
  return;
}

Assistant:

DEFINE_TEST(test_negation_array2) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_non_null(r1);

    for (uint32_t i = 0; i < 100; ++i) {
        roaring_bitmap_add(r1, 2 * i);
        roaring_bitmap_add(r1, 5 * 65536 + 2 * i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1), 200);

    // get the first batch of ones but not the second
    roaring_bitmap_t *notted_r1 = roaring_bitmap_flip(r1, 0U, 100000U);
    assert_non_null(notted_r1);

    // lose 100 for key 0, but gain 100 for key 5
    assert_int_equal(100000, roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    // flip all ones and beyond
    notted_r1 = roaring_bitmap_flip(r1, 0U, 1000000U);
    assert_non_null(notted_r1);
    assert_int_equal(1000000 - 200, roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    // Flip some bits in the middle
    notted_r1 = roaring_bitmap_flip(r1, 100000U, 200000U);
    assert_non_null(notted_r1);
    assert_int_equal(100000 + 200, roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    // flip almost all of the bits, end at an even boundary
    notted_r1 = roaring_bitmap_flip(r1, 1U, 65536 * 6);
    assert_non_null(notted_r1);
    assert_int_equal(65536 * 6 - 200 + 1,
                     roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    // flip first bunch of the bits, end at an even boundary
    notted_r1 = roaring_bitmap_flip(r1, 1U, 65536 * 5);
    assert_non_null(notted_r1);
    assert_int_equal(65536 * 5 - 100 + 1 + 100,
                     roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    roaring_bitmap_free(r1);
}